

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

uint32_t ly_ctx_get_modules_hash(ly_ctx *ctx)

{
  char *pcVar1;
  uint32_t uVar2;
  size_t sVar3;
  lysp_feature *local_38;
  lysp_feature *f;
  uint32_t local_28;
  uint32_t fi;
  uint32_t hash;
  uint32_t i;
  lys_module *mod;
  ly_ctx *ctx_local;
  
  mod = (lys_module *)ctx;
  fi = ly_ctx_internal_modules_count(ctx);
  local_28 = 0;
  f._4_4_ = 0;
  local_38 = (lysp_feature *)0x0;
  if (mod == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_get_modules_hash");
    ctx_local._4_4_ = 0;
  }
  else {
    while (_hash = ly_ctx_get_module_iter((ly_ctx *)mod,&fi), uVar2 = local_28,
          _hash != (lys_module *)0x0) {
      pcVar1 = _hash->name;
      sVar3 = strlen(_hash->name);
      uVar2 = lyht_hash_multi(uVar2,pcVar1,sVar3);
      local_28 = uVar2;
      if (_hash->revision != (char *)0x0) {
        pcVar1 = _hash->revision;
        sVar3 = strlen(_hash->revision);
        local_28 = lyht_hash_multi(uVar2,pcVar1,sVar3);
      }
      while (local_38 = lysp_feature_next(local_38,_hash->parsed,(uint32_t *)((long)&f + 4)),
            uVar2 = local_28, local_38 != (lysp_feature *)0x0) {
        if ((local_38->flags & 0x20) != 0) {
          pcVar1 = local_38->name;
          sVar3 = strlen(local_38->name);
          local_28 = lyht_hash_multi(uVar2,pcVar1,sVar3);
        }
      }
      local_28 = lyht_hash_multi(local_28,(char *)&_hash->implemented,1);
    }
    ctx_local._4_4_ = lyht_hash_multi(local_28,(char *)0x0,0);
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF uint32_t
ly_ctx_get_modules_hash(const struct ly_ctx *ctx)
{
    const struct lys_module *mod;
    uint32_t i = ly_ctx_internal_modules_count(ctx), hash = 0, fi = 0;
    struct lysp_feature *f = NULL;

    LY_CHECK_ARG_RET(ctx, ctx, 0);

    while ((mod = ly_ctx_get_module_iter(ctx, &i))) {
        /* name */
        hash = lyht_hash_multi(hash, mod->name, strlen(mod->name));

        /* revision */
        if (mod->revision) {
            hash = lyht_hash_multi(hash, mod->revision, strlen(mod->revision));
        }

        /* enabled features */
        while ((f = lysp_feature_next(f, mod->parsed, &fi))) {
            if (f->flags & LYS_FENABLED) {
                hash = lyht_hash_multi(hash, f->name, strlen(f->name));
            }
        }

        /* imported/implemented */
        hash = lyht_hash_multi(hash, (char *)&mod->implemented, sizeof mod->implemented);
    }

    hash = lyht_hash_multi(hash, NULL, 0);
    return hash;
}